

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O2

uint32_t duckdb_apache::thrift::protocol::skip<duckdb_apache::thrift::protocol::TProtocol>
                   (TProtocol *prot,TType type)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  TProtocolException *this;
  uint uVar6;
  uint32_t size;
  bool boolv;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint32_t size_2;
  
  TProtocol::incrementInputRecursionDepth(prot);
  switch(type) {
  case T_BOOL:
    uVar2 = (*prot->_vptr_TProtocol[0x23])(prot,&boolv);
    break;
  case T_BYTE:
    _boolv = _boolv & 0xffffffffffffff00;
    uVar2 = (*prot->_vptr_TProtocol[0x25])(prot);
    break;
  case T_DOUBLE:
    uVar2 = (*prot->_vptr_TProtocol[0x29])(prot,&boolv);
    break;
  default:
    this = (TProtocolException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&boolv,"invalid TType",(allocator *)&size);
    TProtocolException::TProtocolException(this,INVALID_DATA,(string *)&boolv);
    __cxa_throw(this,&TProtocolException::typeinfo,TException::~TException);
  case T_I16:
    uVar2 = (*prot->_vptr_TProtocol[0x26])(prot,&boolv);
    break;
  case T_I32:
    uVar2 = (*prot->_vptr_TProtocol[0x27])(prot,&boolv);
    break;
  case T_I64:
    uVar2 = (*prot->_vptr_TProtocol[0x28])(prot,&boolv);
    break;
  case T_STRING:
    _boolv = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    uVar2 = (*prot->_vptr_TProtocol[0x2b])(prot,&boolv);
    goto LAB_01de1db6;
  case T_STRUCT:
    _boolv = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    iVar1 = (*prot->_vptr_TProtocol[0x19])(prot,&boolv);
    while( true ) {
      iVar5 = (*prot->_vptr_TProtocol[0x1b])(prot,&boolv,&size,&size_2);
      if (size == 0) break;
      uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,size);
      iVar4 = (*prot->_vptr_TProtocol[0x1c])(prot);
      iVar1 = uVar2 + iVar5 + iVar1 + iVar4;
    }
    iVar4 = (*prot->_vptr_TProtocol[0x1a])(prot);
    uVar2 = iVar4 + iVar5 + iVar1;
LAB_01de1db6:
    std::__cxx11::string::~string((string *)&boolv);
    break;
  case T_MAP:
    iVar1 = (*prot->_vptr_TProtocol[0x1d])(prot,&boolv,&size,&size_2);
    for (uVar6 = 0; uVar6 < size_2; uVar6 = uVar6 + 1) {
      uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,_boolv);
      uVar3 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,size);
      iVar1 = uVar2 + iVar1 + uVar3;
    }
    iVar5 = (*prot->_vptr_TProtocol[0x1e])(prot);
    goto LAB_01de1d9e;
  case T_SET:
    iVar1 = (*prot->_vptr_TProtocol[0x21])(prot,&boolv,&size);
    for (uVar6 = 0; uVar6 < size; uVar6 = uVar6 + 1) {
      uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,_boolv);
      iVar1 = iVar1 + uVar2;
    }
    iVar5 = (*prot->_vptr_TProtocol[0x22])(prot);
    goto LAB_01de1d9e;
  case T_LIST:
    iVar1 = (*prot->_vptr_TProtocol[0x1f])(prot,&boolv,&size);
    for (uVar6 = 0; uVar6 < size; uVar6 = uVar6 + 1) {
      uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,_boolv);
      iVar1 = iVar1 + uVar2;
    }
    iVar5 = (*prot->_vptr_TProtocol[0x20])(prot);
LAB_01de1d9e:
    uVar2 = iVar5 + iVar1;
  }
  prot->input_recursion_depth_ = prot->input_recursion_depth_ - 1;
  return uVar2;
}

Assistant:

uint32_t skip(Protocol_& prot, TType type) {
  TInputRecursionTracker tracker(prot);

  switch (type) {
  case T_BOOL: {
    bool boolv;
    return prot.readBool(boolv);
  }
  case T_BYTE: {
    int8_t bytev = 0;
    return prot.readByte(bytev);
  }
  case T_I16: {
    int16_t i16;
    return prot.readI16(i16);
  }
  case T_I32: {
    int32_t i32;
    return prot.readI32(i32);
  }
  case T_I64: {
    int64_t i64;
    return prot.readI64(i64);
  }
  case T_DOUBLE: {
    double dub;
    return prot.readDouble(dub);
  }
  case T_STRING: {
    std::string str;
    return prot.readBinary(str);
  }
  case T_STRUCT: {
    uint32_t result = 0;
    std::string name;
    int16_t fid;
    TType ftype;
    result += prot.readStructBegin(name);
    while (true) {
      result += prot.readFieldBegin(name, ftype, fid);
      if (ftype == T_STOP) {
        break;
      }
      result += skip(prot, ftype);
      result += prot.readFieldEnd();
    }
    result += prot.readStructEnd();
    return result;
  }
  case T_MAP: {
    uint32_t result = 0;
    TType keyType;
    TType valType;
    uint32_t i, size;
    result += prot.readMapBegin(keyType, valType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, keyType);
      result += skip(prot, valType);
    }
    result += prot.readMapEnd();
    return result;
  }
  case T_SET: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readSetBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readSetEnd();
    return result;
  }
  case T_LIST: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readListBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readListEnd();
    return result;
  }
  default:
    break;
  }

  throw TProtocolException(TProtocolException::INVALID_DATA,
                           "invalid TType");
}